

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util.cc
# Opt level: O2

bool google::protobuf::internal::LookUpEnumValue
               (EnumEntry *enums,size_t size,StringPiece name,int *value)

{
  bool bVar1;
  EnumEntry *pEVar2;
  EnumEntry local_40;
  
  local_40.name.length_ = name.length_;
  local_40.name.ptr_ = name.ptr_;
  local_40.value = 0;
  pEVar2 = std::
           __lower_bound<google::protobuf::internal::EnumEntry_const*,google::protobuf::internal::EnumEntry,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(google::protobuf::internal::EnumEntry_const&,google::protobuf::internal::EnumEntry_const&)>>
                     (enums,enums + size,&local_40,
                      (_Iter_comp_val<bool_(*)(const_google::protobuf::internal::EnumEntry_&,_const_google::protobuf::internal::EnumEntry_&)>
                       )0x2b7905);
  if ((pEVar2 != enums + size) &&
     (bVar1 = stringpiece_internal::operator==(pEVar2->name,name), bVar1)) {
    *value = pEVar2->value;
    return true;
  }
  return false;
}

Assistant:

bool LookUpEnumValue(const EnumEntry* enums, size_t size,
                     StringPiece name, int* value) {
  EnumEntry target{name, 0};
  auto it = std::lower_bound(enums, enums + size, target, EnumCompareByName);
  if (it != enums + size && it->name == name) {
    *value = it->value;
    return true;
  }
  return false;
}